

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uic.cpp
# Opt level: O3

bool __thiscall Uic::printDependencies(Uic *this)

{
  Option *pOVar1;
  DomIncludes *pDVar2;
  QArrayData *pQVar3;
  DomInclude **ppDVar4;
  long lVar5;
  QArrayData *pQVar6;
  longlong lVar7;
  long lVar8;
  DomCustomWidgets *pDVar9;
  DomCustomWidget **ppDVar10;
  FILE *pFVar11;
  char cVar12;
  DomUI *this_00;
  undefined8 *puVar13;
  bool bVar14;
  long lVar15;
  long in_FS_OFFSET;
  QXmlStreamReader reader;
  QArrayData *local_80;
  undefined8 *local_78;
  QString local_68;
  QArrayData *local_50;
  char16_t *local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pOVar1 = this->opt;
  local_50 = &((pOVar1->inputFile).d.d)->super_QArrayData;
  local_48 = (pOVar1->inputFile).d.ptr;
  local_40 = (pOVar1->inputFile).d.size;
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_50->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_50->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_68);
  if (local_40 == 0) {
    bVar14 = false;
    cVar12 = QFile::open(&local_68,_stdin,1,0);
    if (cVar12 == '\0') goto LAB_001754d2;
LAB_0017525a:
    local_80 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    QXmlStreamReader::QXmlStreamReader((QXmlStreamReader *)&local_80);
    QXmlStreamReader::setDevice((QIODevice *)&local_80);
    this_00 = parseUiFile((QXmlStreamReader *)&local_80);
    QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&local_80);
    if (this_00 != (DomUI *)0x0) {
      pDVar2 = this_00->m_includes;
      if (pDVar2 != (DomIncludes *)0x0) {
        pQVar3 = &((pDVar2->m_include).d.d)->super_QArrayData;
        ppDVar4 = (pDVar2->m_include).d.ptr;
        lVar5 = (pDVar2->m_include).d.size;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        if (lVar5 != 0) {
          lVar15 = 0;
          do {
            puVar13 = *(undefined8 **)((long)ppDVar4 + lVar15);
            pQVar6 = (QArrayData *)*puVar13;
            lVar7 = puVar13[1];
            lVar8 = puVar13[2];
            if (pQVar6 != (QArrayData *)0x0) {
              LOCK();
              (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            pFVar11 = _stdout;
            if (lVar8 != 0) {
              QString::toLocal8Bit_helper((QChar *)&local_80,lVar7);
              puVar13 = local_78;
              if (local_78 == (undefined8 *)0x0) {
                puVar13 = &QByteArray::_empty;
              }
              fprintf(pFVar11,"%s\n",puVar13);
              if (local_80 != (QArrayData *)0x0) {
                LOCK();
                (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_80,1,0x10);
                }
              }
            }
            if (pQVar6 != (QArrayData *)0x0) {
              LOCK();
              (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar6,2,0x10);
              }
            }
            lVar15 = lVar15 + 8;
          } while (lVar5 << 3 != lVar15);
        }
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar3,8,0x10);
          }
        }
      }
      pDVar9 = this_00->m_customWidgets;
      if (pDVar9 != (DomCustomWidgets *)0x0) {
        pQVar3 = &((pDVar9->m_customWidget).d.d)->super_QArrayData;
        ppDVar10 = (pDVar9->m_customWidget).d.ptr;
        lVar5 = (pDVar9->m_customWidget).d.size;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        if (lVar5 != 0) {
          lVar15 = 0;
          do {
            puVar13 = *(undefined8 **)(*(long *)((long)ppDVar10 + lVar15) + 0x38);
            if (puVar13 != (undefined8 *)0x0) {
              pQVar6 = (QArrayData *)*puVar13;
              lVar7 = puVar13[1];
              lVar8 = puVar13[2];
              if (pQVar6 == (QArrayData *)0x0) {
                if (lVar8 != 0) goto LAB_00175414;
              }
              else {
                LOCK();
                (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
                     (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
                if (lVar8 != 0) {
LAB_00175414:
                  pFVar11 = _stdout;
                  QString::toLocal8Bit_helper((QChar *)&local_80,lVar7);
                  puVar13 = local_78;
                  if (local_78 == (undefined8 *)0x0) {
                    puVar13 = &QByteArray::_empty;
                  }
                  fprintf(pFVar11,"%s\n",puVar13);
                  if (local_80 != (QArrayData *)0x0) {
                    LOCK();
                    (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_80,1,0x10);
                    }
                  }
                  if (pQVar6 == (QArrayData *)0x0) goto LAB_00175487;
                }
                LOCK();
                (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
                     (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(pQVar6,2,0x10);
                }
              }
            }
LAB_00175487:
            lVar15 = lVar15 + 8;
          } while (lVar5 << 3 != lVar15);
        }
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar3,8,0x10);
          }
        }
      }
      DomUI::~DomUI(this_00);
      operator_delete(this_00,0x148);
      bVar14 = true;
      goto LAB_001754d2;
    }
  }
  else {
    QFile::setFileName(&local_68);
    cVar12 = QFile::open(&local_68,1);
    if (cVar12 != '\0') goto LAB_0017525a;
  }
  bVar14 = false;
LAB_001754d2:
  QFile::~QFile((QFile *)&local_68);
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar14;
}

Assistant:

bool Uic::printDependencies()
{
    QString fileName = opt.inputFile;

    QFile f;
    if (fileName.isEmpty()) {
        if (!f.open(stdin, QIODevice::ReadOnly))
            return false;
    } else {
        f.setFileName(fileName);
        if (!f.open(QIODevice::ReadOnly))
            return false;
    }

    DomUI *ui = nullptr;
    {
        QXmlStreamReader reader;
        reader.setDevice(&f);
        ui = parseUiFile(reader);
        if (!ui)
            return false;
    }

    if (DomIncludes *includes = ui->elementIncludes()) {
        const auto incls = includes->elementInclude();
        for (DomInclude *incl : incls) {
            QString file = incl->text();
            if (file.isEmpty())
                continue;

            fprintf(stdout, "%s\n", file.toLocal8Bit().constData());
        }
    }

    if (DomCustomWidgets *customWidgets = ui->elementCustomWidgets()) {
        const auto elementCustomWidget = customWidgets->elementCustomWidget();
        for (DomCustomWidget *customWidget : elementCustomWidget) {
            if (DomHeader *header = customWidget->elementHeader()) {
                QString file = header->text();
                if (file.isEmpty())
                    continue;

                fprintf(stdout, "%s\n", file.toLocal8Bit().constData());
            }
        }
    }

    delete ui;

    return true;
}